

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddMisc.c
# Opt level: O1

DdNode * extraBddTuples(DdManager *dd,DdNode *bVarsK,DdNode *bVarsN)

{
  int *piVar1;
  int iVar2;
  DdNode *pDVar3;
  DdNode *pDVar4;
  int iVar5;
  DdNode *T;
  
  iVar2 = 0x7fffffff;
  iVar5 = 0x7fffffff;
  if ((ulong)bVarsK->index != 0x7fffffff) {
    iVar5 = dd->perm[bVarsK->index];
  }
  if ((ulong)bVarsN->index != 0x7fffffff) {
    iVar2 = dd->perm[bVarsN->index];
  }
  pDVar3 = dd->one;
  if (iVar5 < iVar2) {
    return (DdNode *)((ulong)pDVar3 ^ 1);
  }
  if (pDVar3 == bVarsN) {
    return pDVar3;
  }
  pDVar3 = cuddCacheLookup2(dd,extraBddTuples,bVarsK,bVarsN);
  if (pDVar3 != (DdNode *)0x0) {
    return pDVar3;
  }
  pDVar3 = extraBddTuples(dd,bVarsK,(bVarsN->type).kids.T);
  if (pDVar3 == (DdNode *)0x0) {
    return (DdNode *)0x0;
  }
  piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
  *piVar1 = *piVar1 + 1;
  pDVar4 = dd->one;
  if (pDVar4 == bVarsK) {
    T = (DdNode *)((ulong)pDVar4 ^ 1);
  }
  else {
    pDVar4 = extraBddTuples(dd,(bVarsK->type).kids.T,(bVarsN->type).kids.T);
    T = pDVar4;
    if (pDVar4 == (DdNode *)0x0) goto LAB_00806162;
  }
  piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
  *piVar1 = *piVar1 + 1;
  pDVar4 = T;
  if (pDVar3 != T) {
    if (((ulong)T & 1) == 0) {
      pDVar4 = cuddUniqueInter(dd,bVarsN->index,T,pDVar3);
      if (pDVar4 != (DdNode *)0x0) goto LAB_00806120;
    }
    else {
      pDVar4 = cuddUniqueInter(dd,bVarsN->index,(DdNode *)((ulong)T & 0xfffffffffffffffe),
                               (DdNode *)((ulong)pDVar3 ^ 1));
      if (pDVar4 != (DdNode *)0x0) {
        pDVar4 = (DdNode *)((ulong)pDVar4 ^ 1);
        goto LAB_00806120;
      }
    }
    Cudd_RecursiveDeref(dd,pDVar3);
    pDVar3 = T;
LAB_00806162:
    Cudd_RecursiveDeref(dd,pDVar3);
    return (DdNode *)0x0;
  }
LAB_00806120:
  piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
  *piVar1 = *piVar1 + -1;
  piVar1 = (int *)(((ulong)T & 0xfffffffffffffffe) + 4);
  *piVar1 = *piVar1 + -1;
  cuddCacheInsert2(dd,extraBddTuples,bVarsK,bVarsN,pDVar4);
  return pDVar4;
}

Assistant:

DdNode * extraBddTuples( 
  DdManager * dd,    /* the DD manager */
  DdNode * bVarsK,   /* the number of variables in tuples */
  DdNode * bVarsN)   /* the set of all variables */
{
    DdNode *bRes, *bRes0, *bRes1;
    statLine(dd); 

    /* terminal cases */
/*  if ( k < 0 || k > n )
 *      return dd->zero;
 *  if ( n == 0 )
 *      return dd->one; 
 */
    if ( cuddI( dd, bVarsK->index ) < cuddI( dd, bVarsN->index ) )
        return b0;
    if ( bVarsN == b1 )
        return b1;

    /* check cache */
    bRes = cuddCacheLookup2(dd, extraBddTuples, bVarsK, bVarsN);
    if (bRes)
        return(bRes);

    /* ZDD in which is variable is 0 */
/*  bRes0 = extraBddTuples( dd, k,     n-1 ); */
    bRes0 = extraBddTuples( dd, bVarsK, cuddT(bVarsN) );
    if ( bRes0 == NULL ) 
        return NULL;
    cuddRef( bRes0 );

    /* ZDD in which is variable is 1 */
/*  bRes1 = extraBddTuples( dd, k-1,          n-1 ); */
    if ( bVarsK == b1 )
    {
        bRes1 = b0;
        cuddRef( bRes1 );
    }
    else
    {
        bRes1 = extraBddTuples( dd, cuddT(bVarsK), cuddT(bVarsN) );
        if ( bRes1 == NULL ) 
        {
            Cudd_RecursiveDeref( dd, bRes0 );
            return NULL;
        }
        cuddRef( bRes1 );
    }

    /* consider the case when Res0 and Res1 are the same node */
    if ( bRes0 == bRes1 )
        bRes = bRes1;
    /* consider the case when Res1 is complemented */
    else if ( Cudd_IsComplement(bRes1) ) 
    {
        bRes = cuddUniqueInter(dd, bVarsN->index, Cudd_Not(bRes1), Cudd_Not(bRes0));
        if ( bRes == NULL ) 
        {
            Cudd_RecursiveDeref(dd,bRes0);
            Cudd_RecursiveDeref(dd,bRes1);
            return NULL;
        }
        bRes = Cudd_Not(bRes);
    } 
    else 
    {
        bRes = cuddUniqueInter( dd, bVarsN->index, bRes1, bRes0 );
        if ( bRes == NULL ) 
        {
            Cudd_RecursiveDeref(dd,bRes0);
            Cudd_RecursiveDeref(dd,bRes1);
            return NULL;
        }
    }
    cuddDeref( bRes0 );
    cuddDeref( bRes1 );

    /* insert the result into cache */
    cuddCacheInsert2(dd, extraBddTuples, bVarsK, bVarsN, bRes);
    return bRes;

}